

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O2

UBool ucnv_extInitialMatchFromU_63
                (UConverter *cnv,int32_t *cx,UChar32 cp,UChar **src,UChar *srcLimit,char **target,
                char *targetLimit,int32_t **offsets,int32_t srcIndex,UBool flush,
                UErrorCode *pErrorCode)

{
  UChar *src_00;
  uint in_EAX;
  uint uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  ulong uStack_38;
  uint32_t value;
  
  uStack_38 = (ulong)in_EAX;
  src_00 = *src;
  uVar1 = ucnv_extMatchFromU(cx,cp,(UChar *)0x0,0,src_00,
                             (int32_t)((ulong)((long)srcLimit - (long)src_00) >> 1),&value,
                             cnv->useFallback,flush);
  if ((int)uVar1 < 2) {
    if (-1 < (int)uVar1) {
      if (uVar1 != 1) {
        return '\0';
      }
      cnv->useSubChar1 = '\x01';
      return '\0';
    }
    cnv->preFromUFirstCP = cp;
    iVar3 = -2 - uVar1;
    uVar2 = 0;
    iVar4 = 0;
    if (0 < iVar3) {
      iVar4 = iVar3;
    }
    for (; (uint)(iVar4 * 2) != uVar2; uVar2 = uVar2 + 2) {
      *(undefined2 *)((long)cnv->preFromU + uVar2) = *(undefined2 *)((long)src_00 + uVar2);
    }
    *src = (UChar *)((long)src_00 + uVar2);
    cnv->preFromULength = (int8_t)iVar3;
  }
  else {
    if (((value & 0x1f000000) == 0x1000000) && ((cnv->sharedData->mbcs).outputType == 0xdb)) {
      return '\0';
    }
    *src = src_00 + ((ulong)uVar1 - 2);
    ucnv_extWriteFromU(cnv,cx,value,target,targetLimit,offsets,srcIndex,pErrorCode);
  }
  return '\x01';
}

Assistant:

U_CFUNC UBool
ucnv_extInitialMatchFromU(UConverter *cnv, const int32_t *cx,
                          UChar32 cp,
                          const UChar **src, const UChar *srcLimit,
                          char **target, const char *targetLimit,
                          int32_t **offsets, int32_t srcIndex,
                          UBool flush,
                          UErrorCode *pErrorCode) {
    uint32_t value = 0;  /* initialize output-only param to 0 to silence gcc */
    int32_t match;

    /* try to match */
    match=ucnv_extMatchFromU(cx, cp,
                             NULL, 0,
                             *src, (int32_t)(srcLimit-*src),
                             &value,
                             cnv->useFallback, flush);

    /* reject a match if the result is a single byte for DBCS-only */
    if( match>=2 &&
        !(UCNV_EXT_FROM_U_GET_LENGTH(value)==1 &&
          cnv->sharedData->mbcs.outputType==MBCS_OUTPUT_DBCS_ONLY)
    ) {
        /* advance src pointer for the consumed input */
        *src+=match-2; /* remove 2 for the initial code point */

        /* write result to target */
        ucnv_extWriteFromU(cnv, cx,
                           value,
                           target, targetLimit,
                           offsets, srcIndex,
                           pErrorCode);
        return TRUE;
    } else if(match<0) {
        /* save state for partial match */
        const UChar *s;
        int32_t j;

        /* copy the first code point */
        cnv->preFromUFirstCP=cp;

        /* now copy the newly consumed input */
        s=*src;
        match=-match-2; /* remove 2 for the initial code point */
        for(j=0; j<match; ++j) {
            cnv->preFromU[j]=*s++;
        }
        *src=s; /* same as *src=srcLimit; because we reached the end of input */
        cnv->preFromULength=(int8_t)match;
        return TRUE;
    } else if(match==1) {
        /* matched, no mapping but request for <subchar1> */
        cnv->useSubChar1=TRUE;
        return FALSE;
    } else /* match==0 no match */ {
        return FALSE;
    }
}